

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O3

void __thiscall QMimeAllGlobPatterns::removeMimeType(QMimeAllGlobPatterns *this,QString *mimeType)

{
  ulong uVar1;
  Data<QHashPrivate::Node<QString,_QList<QString>_>_> *d;
  PatternsMap *__range1;
  ulong uVar2;
  long in_FS_OFFSET;
  anon_class_16_1_94f2130c_for__M_pred local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  d = (this->m_fastPatterns).d;
  if (d == (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0) {
    d = (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0;
    uVar2 = 0;
LAB_004a5317:
    if (uVar2 == 0 && d == (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0)
    goto LAB_004a53a3;
  }
  else {
    if (1 < (uint)(d->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      d = QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QString>_>_>::detached(d);
      (this->m_fastPatterns).d = d;
    }
    if (d->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar2 = uVar1;
        if (d->numBuckets == uVar2) {
          d = (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0;
          uVar2 = 0;
          break;
        }
        uVar1 = uVar2 + 1;
      } while (d->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
      goto LAB_004a5317;
    }
    uVar2 = 0;
  }
  do {
    QtPrivate::sequential_erase_with_copy<QList<QString>,QString>
              ((QList<QString> *)
               (((d->spans[uVar2 >> 7].entries)->storage).data +
               (ulong)((uint)d->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] * 0x30) + 0x18),
               mimeType);
    do {
      if (d->numBuckets - 1 == uVar2) {
        uVar2 = 0;
        d = (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0;
        break;
      }
      uVar2 = uVar2 + 1;
    } while (d->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
  } while ((uVar2 != 0) || (d != (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0));
LAB_004a53a3:
  local_38.mimeType.m_data = (mimeType->d).ptr;
  local_38.mimeType.m_size = (mimeType->d).size;
  QtPrivate::
  sequential_erase_if<QList<QMimeGlobPattern>,QMimeGlobPatternList::removeMimeType(QStringView)::_lambda(QMimeGlobPattern_const&)_1_>
            (&(this->m_highWeightGlobs).super_QList<QMimeGlobPattern>,&local_38);
  local_38.mimeType.m_data = (mimeType->d).ptr;
  local_38.mimeType.m_size = (mimeType->d).size;
  QtPrivate::
  sequential_erase_if<QList<QMimeGlobPattern>,QMimeGlobPatternList::removeMimeType(QStringView)::_lambda(QMimeGlobPattern_const&)_1_>
            (&(this->m_lowWeightGlobs).super_QList<QMimeGlobPattern>,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeAllGlobPatterns::removeMimeType(const QString &mimeType)
{
    for (auto &x : m_fastPatterns)
        x.removeAll(mimeType);
    m_highWeightGlobs.removeMimeType(mimeType);
    m_lowWeightGlobs.removeMimeType(mimeType);
}